

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval.h
# Opt level: O3

bool __thiscall
embree::sse2::PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::eval_general
          (PatchEval<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          SubdividedGeneralPatch *This,float U,float V,size_t depth)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float v;
  float u;
  float local_30;
  float local_2c;
  
  fVar2 = floorf(U * 0.5);
  fVar3 = U * 0.5 - fVar2;
  local_2c = fVar3 + fVar3 + -0.5;
  fVar3 = floorf(V * 0.5);
  fVar4 = V * 0.5 - fVar3;
  local_30 = fVar4 + fVar4 + -0.5;
  bVar1 = eval(this,(Ref)This->child[(uint)((int)(long)fVar2 + (int)(long)fVar3 * 4)].ptr,&local_2c,
               &local_30,1.0,depth + 1);
  return bVar1;
}

Assistant:

bool eval_general(const typename Patch::SubdividedGeneralPatch* This, const float U, const float V, const size_t depth)
        {
          const unsigned l = (unsigned) floor(0.5f*U); const float u = 2.0f*frac(0.5f*U)-0.5f; 
          const unsigned h = (unsigned) floor(0.5f*V); const float v = 2.0f*frac(0.5f*V)-0.5f; 
          const unsigned i = 4*h+l; assert(i<This->N);
          return eval(This->child[i],u,v,1.0f,depth+1);
        }